

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisetTest.cpp
# Opt level: O2

void print<ft::multiset<int,ft::greater<int>,ft::allocator<int>>>
               (multiset<int,_ft::greater<int>,_ft::allocator<int>_> *t,char *s)

{
  ostream *poVar1;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_40;
  
  local_40._vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dc90;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar1," contains:");
  local_40.m_tree =
       &(t->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
        super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree;
  local_40.m_node =
       ((t->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
        super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.m_first)->parent
  ;
  while (local_40.m_node !=
         (t->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
         super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.m_last) {
    poVar1 = std::operator<<((ostream *)&std::cout,' ');
    std::ostream::operator<<(poVar1,(local_40.m_node)->value);
    ft::treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(&local_40);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << ' ' << *it;
	std::cout << std::endl;
}